

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamStandardIndex_p.cpp
# Opt level: O3

uint64_t __thiscall
BamTools::Internal::BamStandardIndex::CalculateMinOffset
          (BamStandardIndex *this,BaiReferenceSummary *refSummary,uint32_t *begin)

{
  int iVar1;
  uint64_t uVar2;
  uint uVar3;
  int *index;
  int shiftedBegin;
  undefined8 local_8;
  
  iVar1 = refSummary->NumLinearOffsets;
  if (iVar1 == 0) {
    return 0;
  }
  index = (int *)&local_8;
  uVar3 = *begin >> 0xe;
  local_8 = (ulong)uVar3;
  if (iVar1 <= (int)uVar3) {
    index = (int *)((long)&local_8 + 4);
    local_8 = CONCAT44(iVar1 + -1,uVar3);
  }
  uVar2 = LookupLinearOffset(this,refSummary,index);
  return uVar2;
}

Assistant:

uint64_t BamStandardIndex::CalculateMinOffset(const BaiReferenceSummary& refSummary,
                                              const uint32_t& begin)
{
    // if no linear offsets exist, return 0
    if (refSummary.NumLinearOffsets == 0) return 0;

    // if 'begin' starts beyond last linear offset, use the last linear offset as minimum
    // else use the offset corresponding to the requested start position
    const int shiftedBegin = begin >> BamStandardIndex::BAM_LIDX_SHIFT;
    if (shiftedBegin >= refSummary.NumLinearOffsets)
        return LookupLinearOffset(refSummary, refSummary.NumLinearOffsets - 1);
    else
        return LookupLinearOffset(refSummary, shiftedBegin);
}